

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int drawnumber_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,
                    _array *ap,t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,
                    int dbl,int doit)

{
  t_float tVar1;
  int local_68;
  int local_64;
  int onset;
  int type;
  int y2;
  int x2;
  int y1;
  int x1;
  t_drawnumber *x;
  t_float basey_local;
  t_float basex_local;
  _array *ap_local;
  t_scalar *sc_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  _y1 = (t_drawnumber *)z;
  x._0_4_ = basey;
  x._4_4_ = basex;
  _basey_local = ap;
  ap_local = (_array *)sc;
  sc_local = (t_scalar *)template;
  template_local = (t_template *)data;
  data_local = (t_word *)glist;
  glist_local = (_glist *)z;
  drawnumber_getrect(z,glist,data,template,basex,basey,&x2,&y2,&type,&onset);
  if ((((x2 <= xpix) && (xpix <= type)) && (y2 <= ypix)) &&
     ((ypix <= onset &&
      ((local_64 = drawnumber_gettype(_y1,(t_word *)template_local,(t_template *)sc_local,&local_68)
       , local_64 == 0 || (local_64 == 1)))))) {
    if (doit != 0) {
      *(t_word **)((pd_maininstance.pd_gui)->i_template + 200) = data_local;
      *(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe0) = template_local;
      *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xe8) = sc_local;
      *(_array **)((pd_maininstance.pd_gui)->i_template + 0xd0) = ap_local;
      *(_array **)((pd_maininstance.pd_gui)->i_template + 0xd8) = _basey_local;
      *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0x10c) = 1;
      tVar1 = template_getfloat((t_template *)sc_local,_y1->x_fieldname,(t_word *)template_local,0);
      *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xc0) = tVar1;
      *(int *)((pd_maininstance.pd_gui)->i_template + 0x108) = local_64;
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0xd0) == 0) {
        gpointer_setarray((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),
                          *(_array **)((pd_maininstance.pd_gui)->i_template + 0xd8),
                          *(t_word **)((pd_maininstance.pd_gui)->i_template + 0xe0));
      }
      else {
        gpointer_setglist((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),
                          *(_glist **)((pd_maininstance.pd_gui)->i_template + 200),
                          *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xd0));
      }
      glist_grab((_glist *)data_local,(t_gobj *)glist_local,drawnumber_motionfn,drawnumber_key,xpix,
                 ypix);
    }
    return 1;
  }
  return 0;
}

Assistant:

static int drawnumber_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_drawnumber *x = (t_drawnumber *)z;
    int x1, y1, x2, y2, type, onset;
    drawnumber_getrect(z, glist,
        data, template, basex, basey,
        &x1, &y1, &x2, &y2);
    if (xpix >= x1 && xpix <= x2 && ypix >= y1 && ypix <= y2 &&
        ((type = drawnumber_gettype(x, data, template, &onset)) == DT_FLOAT ||
            type == DT_SYMBOL))
    {
        if (doit)
        {
            TEMPLATE->drawnumber_motion_glist = glist;
            TEMPLATE->drawnumber_motion_wp = data;
            TEMPLATE->drawnumber_motion_template = template;
            TEMPLATE->drawnumber_motion_scalar = sc;
            TEMPLATE->drawnumber_motion_array = ap;
            TEMPLATE->drawnumber_motion_firstkey = 1;
            TEMPLATE->drawnumber_motion_ycumulative =
                template_getfloat(template, x->x_fieldname, data, 0);
            TEMPLATE->drawnumber_motion_type = type;
            if (TEMPLATE->drawnumber_motion_scalar)
                gpointer_setglist(&TEMPLATE->drawnumber_motion_gpointer,
                    TEMPLATE->drawnumber_motion_glist,
                        TEMPLATE->drawnumber_motion_scalar);
            else gpointer_setarray(&TEMPLATE->drawnumber_motion_gpointer,
                    TEMPLATE->drawnumber_motion_array,
                        TEMPLATE->drawnumber_motion_wp);
            glist_grab(glist, z, drawnumber_motionfn, drawnumber_key,
                xpix, ypix);
        }
        return (1);
    }
    else return (0);
}